

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void duckdb::FlatVector::SetNull(Vector *vector,idx_t idx,bool is_null)

{
  byte bVar1;
  bool bVar2;
  LogicalType *this;
  idx_t iVar3;
  byte in_DL;
  Vector *in_RSI;
  Vector *in_RDI;
  idx_t i;
  idx_t child_offset;
  idx_t array_size;
  Vector *child;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *entry;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *__range2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *entries;
  PhysicalType internal_type;
  LogicalType *type;
  Vector *in_stack_ffffffffffffff88;
  LogicalType *in_stack_ffffffffffffff90;
  ulong uVar4;
  idx_t in_stack_ffffffffffffff98;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffa0;
  __normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
  local_40;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_38;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_30;
  PhysicalType local_21;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  TemplatedValidityMask<unsigned_long>::Set
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0));
  if ((bVar1 & 1) != 0) {
    this = Vector::GetType(in_RDI);
    local_21 = LogicalType::InternalType(this);
    if (local_21 == STRUCT) {
      local_38 = StructVector::GetEntries(in_stack_ffffffffffffff88);
      local_30 = local_38;
      local_40._M_current =
           (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
           ::std::
           vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ::begin((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                    *)in_stack_ffffffffffffff88);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ::end((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
             *)in_stack_ffffffffffffff88);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                                 *)in_stack_ffffffffffffff90,
                                (__normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                                 *)in_stack_ffffffffffffff88), bVar2) {
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
        ::operator*(&local_40);
        unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                  ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                   in_stack_ffffffffffffff90);
        SetNull(in_RSI,CONCAT17(bVar1,in_stack_ffffffffffffffe8),SUB81((ulong)this >> 0x38,0));
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
        ::operator++(&local_40);
      }
    }
    else if (local_21 == ARRAY) {
      ArrayVector::GetEntry((Vector *)0x3e1123);
      iVar3 = ArrayType::GetSize(in_stack_ffffffffffffff90);
      for (uVar4 = 0; uVar4 < iVar3; uVar4 = uVar4 + 1) {
        SetNull(in_RSI,CONCAT17(bVar1,in_stack_ffffffffffffffe8),SUB81((ulong)this >> 0x38,0));
      }
    }
  }
  return;
}

Assistant:

void FlatVector::SetNull(Vector &vector, idx_t idx, bool is_null) {
	D_ASSERT(vector.GetVectorType() == VectorType::FLAT_VECTOR);
	vector.validity.Set(idx, !is_null);
	if (!is_null) {
		return;
	}

	auto &type = vector.GetType();
	auto internal_type = type.InternalType();

	// Set all child entries to NULL.
	if (internal_type == PhysicalType::STRUCT) {
		auto &entries = StructVector::GetEntries(vector);
		for (auto &entry : entries) {
			FlatVector::SetNull(*entry, idx, is_null);
		}
		return;
	}

	// Set all child entries to NULL.
	if (internal_type == PhysicalType::ARRAY) {
		auto &child = ArrayVector::GetEntry(vector);
		auto array_size = ArrayType::GetSize(type);
		auto child_offset = idx * array_size;
		for (idx_t i = 0; i < array_size; i++) {
			FlatVector::SetNull(child, child_offset + i, is_null);
		}
	}
}